

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

void __thiscall irr::video::CNullDriver::removeOcclusionQuery(CNullDriver *this,ISceneNode *node)

{
  SOccQuery *pSVar1;
  __normal_iterator<const_irr::video::CNullDriver::SOccQuery_*,_std::vector<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>_>
  _Var2;
  ulong uVar3;
  SOccQuery local_50;
  
  local_50.Mesh = (IMesh *)0x0;
  local_50.field_2.PID = (void *)0x0;
  local_50.Result = 0xffffffff;
  local_50.Run = 0xffffffff;
  if (node != (ISceneNode *)0x0) {
    *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) =
         *(int *)(node->_vptr_ISceneNode[-3] + -0x20 + (long)(node->AbsoluteTransformation).M) + 1;
  }
  local_50.Node = node;
  _Var2 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SOccQuery_const*,std::vector<irr::video::CNullDriver::SOccQuery,std::allocator<irr::video::CNullDriver::SOccQuery>>>,__gnu_cxx::__ops::_Iter_equals_val<irr::video::CNullDriver::SOccQuery_const>>
                    ((this->OcclusionQueries).m_data.
                     super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->OcclusionQueries).m_data.
                     super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  pSVar1 = (this->OcclusionQueries).m_data.
           super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)_Var2._M_current -
          (long)(this->OcclusionQueries).m_data.
                super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                ._M_impl.super__Vector_impl_data._M_start;
  SOccQuery::~SOccQuery(&local_50);
  if ((~uVar3 & 0x1fffffffe0) != 0 && _Var2._M_current != pSVar1) {
    *(byte *)&node->AutomaticCullingState = (byte)node->AutomaticCullingState & 0xf7;
    std::
    vector<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
    ::_M_erase(&(this->OcclusionQueries).m_data,
               (SOccQuery *)
               ((long)&((this->OcclusionQueries).m_data.
                        super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
                        ._M_impl.super__Vector_impl_data._M_start)->Node + (uVar3 & 0x1fffffffe0)));
  }
  return;
}

Assistant:

void CNullDriver::removeOcclusionQuery(scene::ISceneNode *node)
{
	// search for query
	s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index != -1) {
		node->setAutomaticCulling(node->getAutomaticCulling() & ~scene::EAC_OCC_QUERY);
		OcclusionQueries.erase(index);
	}
}